

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
SerializeMessageSet<proto2_unittest::TestAllTypes>::TestBody
          (SerializeMessageSet<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  MutableType this_00;
  MutableType this_01;
  uint32_t *puVar2;
  Arena *arena;
  UnknownFieldSet *pUVar3;
  char *pcVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  RawMessageSet_Item *pRVar7;
  string *psVar8;
  char *in_R9;
  AssertHelper local_3a0;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_7;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_340;
  Message local_338;
  string_view local_330;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__3;
  TestMessageSetExtension2 message2;
  Message local_2e0;
  int32_t local_2d8;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_2a0;
  Message local_298;
  string_view local_290;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__2;
  TestMessageSetExtension1 message1;
  Message local_230;
  int32_t local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  Message local_208;
  int32_t local_200;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  Message local_1e0;
  int32_t local_1d8;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  Message local_1b8;
  int local_1b0 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  Message local_190;
  int local_188 [2];
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  AssertHelper local_150;
  Message local_148;
  string_view local_140;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  RawMessageSet raw;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  string data;
  undefined1 local_58 [8];
  TestMessageSet message_set;
  SerializeMessageSet<proto2_unittest::TestAllTypes> *this_local;
  
  message_set.field_0._24_8_ = this;
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet((TestMessageSet *)local_58);
  this_00 = proto2_wireformat_unittest::TestMessageSet::
            MutableExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,(unsigned_char)11,false>
                      ((TestMessageSet *)local_58,
                       (ExtensionIdentifier<proto2_wireformat_unittest::TestMessageSet,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,_(unsigned_char)__v_,_false>
                        *)proto2_unittest::TestMessageSetExtension1::message_set_extension);
  proto2_unittest::TestMessageSetExtension1::set_i(this_00,0x7b);
  this_01 = proto2_wireformat_unittest::TestMessageSet::
            MutableExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension2>,(unsigned_char)11,false>
                      ((TestMessageSet *)local_58,
                       (ExtensionIdentifier<proto2_wireformat_unittest::TestMessageSet,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension2>,_(unsigned_char)__v_,_false>
                        *)proto2_unittest::TestMessageSetExtension2::message_set_extension);
  puVar2 = HasBits<1>::operator[](&(this_01->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this_01);
  ArenaStringPtr::Set(&(this_01->field_0)._impl_.str_,"foo",arena);
  pUVar3 = proto2_wireformat_unittest::TestMessageSet::mutable_unknown_fields
                     ((TestMessageSet *)local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&data.field_2 + 8),"bar");
  UnknownFieldSet::AddLengthDelimited(pUVar3,0x17a6e7,stack0xffffffffffffff88);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_a9 = protobuf::MessageLite::SerializeToString
                       ((MessageLite *)local_58,(string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_a8,
               (AssertionResult *)"message_set.SerializeToString(&data)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x203,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  if (bVar1) {
    proto2_unittest::RawMessageSet::RawMessageSet((RawMessageSet *)&gtest_ar__1.message_);
    local_140 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    local_129 = protobuf::MessageLite::ParseFromString
                          ((MessageLite *)&gtest_ar__1.message_,local_140);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_128,&local_129,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_128,
                 (AssertionResult *)"raw.ParseFromString(data)","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x207,pcVar4);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    if (bVar1) {
      local_188[1] = 0;
      pUVar3 = proto2_unittest::RawMessageSet::unknown_fields
                         ((RawMessageSet *)&gtest_ar__1.message_);
      local_188[0] = UnknownFieldSet::field_count(pUVar3);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_180,"0","raw.unknown_fields().field_count()",local_188 + 1,
                 local_188);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_190);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x209,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_190);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_190);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      local_1b0[1] = 3;
      local_1b0[0] = proto2_unittest::RawMessageSet::item_size
                               ((RawMessageSet *)&gtest_ar__1.message_);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1a8,"3","raw.item_size()",local_1b0 + 1,local_1b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x20b,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
      if (bVar1) {
        pDVar5 = proto2_unittest::TestMessageSetExtension1::descriptor();
        pFVar6 = Descriptor::extension(pDVar5,0);
        local_1d4 = FieldDescriptor::number(pFVar6);
        pRVar7 = proto2_unittest::RawMessageSet::item((RawMessageSet *)&gtest_ar__1.message_,0);
        local_1d8 = proto2_unittest::RawMessageSet_Item::type_id(pRVar7);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1d0,
                   "TestFixture::TestMessageSetExtension1::descriptor() ->extension(0) ->number()",
                   "raw.item(0).type_id()",&local_1d4,&local_1d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
        if (!bVar1) {
          testing::Message::Message(&local_1e0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x20f,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_1e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_1e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
        pDVar5 = proto2_unittest::TestMessageSetExtension2::descriptor();
        pFVar6 = Descriptor::extension(pDVar5,0);
        local_1fc = FieldDescriptor::number(pFVar6);
        pRVar7 = proto2_unittest::RawMessageSet::item((RawMessageSet *)&gtest_ar__1.message_,1);
        local_200 = proto2_unittest::RawMessageSet_Item::type_id(pRVar7);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1f8,
                   "TestFixture::TestMessageSetExtension2::descriptor() ->extension(0) ->number()",
                   "raw.item(1).type_id()",&local_1fc,&local_200);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_208);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x213,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_208);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_208);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        pRVar7 = proto2_unittest::RawMessageSet::item((RawMessageSet *)&gtest_ar__1.message_,2);
        local_224 = proto2_unittest::RawMessageSet_Item::type_id(pRVar7);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_220,"kUnknownTypeId","raw.item(2).type_id()",&kUnknownTypeId,
                   &local_224);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
        if (!bVar1) {
          testing::Message::Message(&local_230);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&message1.field_0 + 0x18),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x214,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&message1.field_0 + 0x18),&local_230);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)((long)&message1.field_0 + 0x18));
          testing::Message::~Message(&local_230);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
        proto2_unittest::TestMessageSetExtension1::TestMessageSetExtension1
                  ((TestMessageSetExtension1 *)&gtest_ar__2.message_);
        pRVar7 = proto2_unittest::RawMessageSet::item((RawMessageSet *)&gtest_ar__1.message_,0);
        psVar8 = proto2_unittest::RawMessageSet_Item::message_abi_cxx11_(pRVar7);
        local_290 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
        local_279 = protobuf::MessageLite::ParseFromString
                              ((MessageLite *)&gtest_ar__2.message_,local_290);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_278,&local_279,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
        if (!bVar1) {
          testing::Message::Message(&local_298);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_5.message_,(internal *)local_278,
                     (AssertionResult *)"message1.ParseFromString(raw.item(0).message())","false",
                     "true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x217,pcVar4);
          testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
          testing::internal::AssertHelper::~AssertHelper(&local_2a0);
          std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_298);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
        local_2d4 = 0x7b;
        local_2d8 = proto2_unittest::TestMessageSetExtension1::i
                              ((TestMessageSetExtension1 *)&gtest_ar__2.message_);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_2d0,"123","message1.i()",&local_2d4,&local_2d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
        if (!bVar1) {
          testing::Message::Message(&local_2e0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&message2.field_0._impl_.str_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x218,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&message2.field_0._impl_.str_,&local_2e0);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&message2.field_0._impl_.str_);
          testing::Message::~Message(&local_2e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
        proto2_unittest::TestMessageSetExtension2::TestMessageSetExtension2
                  ((TestMessageSetExtension2 *)&gtest_ar__3.message_);
        pRVar7 = proto2_unittest::RawMessageSet::item((RawMessageSet *)&gtest_ar__1.message_,1);
        psVar8 = proto2_unittest::RawMessageSet_Item::message_abi_cxx11_(pRVar7);
        local_330 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
        local_319 = protobuf::MessageLite::ParseFromString
                              ((MessageLite *)&gtest_ar__3.message_,local_330);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_318,&local_319,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
        if (!bVar1) {
          testing::Message::Message(&local_338);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_6.message_,(internal *)local_318,
                     (AssertionResult *)"message2.ParseFromString(raw.item(1).message())","false",
                     "true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_340,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x21b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_340,&local_338);
          testing::internal::AssertHelper::~AssertHelper(&local_340);
          std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_338);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
        psVar8 = proto2_unittest::TestMessageSetExtension2::str_abi_cxx11_
                           ((TestMessageSetExtension2 *)&gtest_ar__3.message_);
        testing::internal::EqHelper::
        Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((EqHelper *)local_370,"\"foo\"","message2.str()",(char (*) [4])0x1d63234,psVar8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
        if (!bVar1) {
          testing::Message::Message(&local_378);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x21c,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,&local_378);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_378);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
        pRVar7 = proto2_unittest::RawMessageSet::item((RawMessageSet *)&gtest_ar__1.message_,2);
        psVar8 = proto2_unittest::RawMessageSet_Item::message_abi_cxx11_(pRVar7);
        testing::internal::EqHelper::
        Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((EqHelper *)local_390,"\"bar\"","raw.item(2).message()",(char (*) [4])0x1eb01d8,
                   psVar8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
        if (!bVar1) {
          testing::Message::Message(&local_398);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
          testing::internal::AssertHelper::AssertHelper
                    (&local_3a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x21e,pcVar4);
          testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
          testing::internal::AssertHelper::~AssertHelper(&local_3a0);
          testing::Message::~Message(&local_398);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
        proto2_unittest::TestMessageSetExtension2::~TestMessageSetExtension2
                  ((TestMessageSetExtension2 *)&gtest_ar__3.message_);
        proto2_unittest::TestMessageSetExtension1::~TestMessageSetExtension1
                  ((TestMessageSetExtension1 *)&gtest_ar__2.message_);
      }
    }
    proto2_unittest::RawMessageSet::~RawMessageSet((RawMessageSet *)&gtest_ar__1.message_);
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_58);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, SerializeMessageSet) {
  // Set up a TestMessageSet with two known messages and an unknown one.
  typename TestFixture::TestMessageSet message_set;
  message_set
      .MutableExtension(
          TestFixture::TestMessageSetExtension1::message_set_extension)
      ->set_i(123);
  message_set
      .MutableExtension(
          TestFixture::TestMessageSetExtension2::message_set_extension)
      ->set_str("foo");
  message_set.mutable_unknown_fields()->AddLengthDelimited(kUnknownTypeId,
                                                           "bar");

  std::string data;
  ASSERT_TRUE(message_set.SerializeToString(&data));

  // Parse back using RawMessageSet and check the contents.
  typename TestFixture::RawMessageSet raw;
  ASSERT_TRUE(raw.ParseFromString(data));

  EXPECT_EQ(0, raw.unknown_fields().field_count());

  ASSERT_EQ(3, raw.item_size());
  EXPECT_EQ(TestFixture::TestMessageSetExtension1::descriptor()
                ->extension(0)
                ->number(),
            raw.item(0).type_id());
  EXPECT_EQ(TestFixture::TestMessageSetExtension2::descriptor()
                ->extension(0)
                ->number(),
            raw.item(1).type_id());
  EXPECT_EQ(kUnknownTypeId, raw.item(2).type_id());

  typename TestFixture::TestMessageSetExtension1 message1;
  EXPECT_TRUE(message1.ParseFromString(raw.item(0).message()));
  EXPECT_EQ(123, message1.i());

  typename TestFixture::TestMessageSetExtension2 message2;
  EXPECT_TRUE(message2.ParseFromString(raw.item(1).message()));
  EXPECT_EQ("foo", message2.str());

  EXPECT_EQ("bar", raw.item(2).message());
}